

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string local_630 [4];
  int res;
  undefined1 local_610 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_492;
  allocator local_491;
  string local_490;
  undefined1 local_470 [8];
  string findExpr;
  Glob gl;
  string local_3f0 [32];
  undefined1 local_3d0 [8];
  ostringstream cmCPackLog_msg;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228 [8];
  string component_path;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_122;
  allocator local_121;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string outputFileName;
  undefined1 local_70 [8];
  string packageFileName;
  string localToplevel;
  int retval;
  string *packageName_local;
  string *initialTopLevel_local;
  cmCPackDebGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)initialTopLevel);
  cmsys::SystemTools::GetParentDirectory
            ((string *)local_70,&(this->super_cmCPackGenerator).toplevel);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"CPACK_PACKAGE_FILE_NAME",&local_121);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,pcVar4,&local_122);
  std::operator+(&local_e0,&local_100,"-");
  std::operator+(&local_c0,&local_e0,packageName);
  iVar3 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_122);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::operator+(&local_148,"/",packageName);
  std::__cxx11::string::operator+=
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"CPACK_TEMPORARY_DIRECTORY",&local_169);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_168,pcVar4);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::operator+(&local_190,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::__cxx11::string::operator+=((string *)local_70,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"CPACK_OUTPUT_FILE_NAME",&local_1b1);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1b0,pcVar4);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_1d9);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1d8,pcVar4);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"CPACK_DEB_PACKAGE_COMPONENT",
             (allocator *)(component_path.field_2._M_local_buf + 0xf));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_200,pcVar4);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"/",&local_229);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::operator+=(local_228,(string *)packageName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_250,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",&local_251);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_250,pcVar4);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar2 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackDeb.cmake");
  if (bVar2) {
    cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"GEN_WDIR",&local_491);
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_490);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_470,pcVar4,&local_492);
    std::allocator<char>::~allocator((allocator<char> *)&local_492);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::operator+=((string *)local_470,"/*");
    cmsys::Glob::RecurseOn((Glob *)((long)&findExpr.field_2 + 8));
    bVar2 = cmsys::Glob::FindFiles
                      ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_470,(GlobMessages *)0x0
                      );
    if (bVar2) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,__x);
      iVar3 = createDeb(this);
      localToplevel.field_2._13_3_ = 0;
      localToplevel.field_2._M_local_buf[0xc] = iVar3 == 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_70);
      this_local._4_4_ = localToplevel.field_2._12_4_;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      poVar5 = std::operator<<((ostream *)local_610,
                               "Cannot find any files in the installed directory");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,100,pcVar4);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      this_local._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_470);
    cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
    poVar5 = std::operator<<((ostream *)local_3d0,"Error while execution CPackDeb.cmake");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x58,pcVar4);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string initialTopLevel,
                                        std::string packageName)
  {
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
      cmSystemTools::GetParentDirectory(toplevel)
  );
  std::string outputFileName(
      std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME"))
  +"-"+packageName + this->GetOutputExtension()
  );

  localToplevel += "/"+ packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY",localToplevel.c_str());
  packageFileName += "/"+ outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME",outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
      packageFileName.c_str());
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT",packageName.c_str());
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = "/";
  component_path += packageName;
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
                  component_path.c_str());
  if (!this->ReadListFile("CPackDeb.cmake"))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Error while execution CPackDeb.cmake" << std::endl);
    retval = 0;
    return retval;
    }

  cmsys::Glob gl;
  std::string findExpr(this->GetOption("GEN_WDIR"));
  findExpr += "/*";
  gl.RecurseOn();
  if ( !gl.FindFiles(findExpr) )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Cannot find any files in the installed directory" << std::endl);
    return 0;
    }
  packageFiles = gl.GetFiles();

  int res = createDeb();
  if (res != 1)
    {
    retval = 0;
    }
  // add the generated package to package file names list
  packageFileNames.push_back(packageFileName);
  return retval;
}